

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_h2_parser(lws *wsi,uchar *in,lws_filepos_t inlen,lws_filepos_t *inused)

{
  int32_t *piVar1;
  undefined1 *puVar2;
  byte bVar3;
  char cVar4;
  short sVar5;
  ushort uVar6;
  undefined4 uVar7;
  lws_h2_netconn *plVar8;
  lws_h2_netconn *plVar9;
  lws_context *plVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  lws_h2_protocol_send *plVar14;
  lws *plVar15;
  size_t sVar16;
  lws *plVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint32_t uVar23;
  ulong uVar24;
  byte *pbVar25;
  ulong uVar26;
  bool bVar27;
  byte *local_60;
  
  plVar8 = (wsi->h2).h2n;
  pbVar25 = in;
  if (plVar8 == (lws_h2_netconn *)0x0) {
    iVar13 = 1;
    goto LAB_0012afe0;
  }
LAB_00129c34:
  do {
    do {
      while( true ) {
        while( true ) {
          uVar26 = inlen - 1;
          if (inlen == 0) {
            iVar13 = 0;
            goto LAB_0012afe0;
          }
          local_60 = pbVar25 + 1;
          bVar11 = *pbVar25;
          sVar5 = (short)wsi->wsistate;
          uVar21 = (uint)bVar11;
          if (((sVar5 == 0x10f) || (sVar5 == 0x119)) || (sVar5 == 0x30d)) break;
          inlen = uVar26;
          pbVar25 = local_60;
          if (sVar5 == 0x20c) {
            uVar22 = plVar8->count;
            uVar12 = uVar22 + 1;
            plVar8->count = uVar12;
            if ((int)"PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar22] != uVar21) goto LAB_0012afd3;
            if ("PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n"[uVar12] == '\0') {
              _lws_log(8,"http2: %p: established\n",wsi);
              lwsi_set_state(wsi,0x30d);
              lws_validity_confirmed(wsi);
              plVar8->count = 0;
              (wsi->txc).tx_cr = 0xffff;
              plVar14 = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
              if (plVar14 == (lws_h2_protocol_send *)0x0) {
                iVar13 = 1;
                goto LAB_0012afe0;
              }
              lws_pps_schedule(wsi,plVar14);
            }
          }
        }
        bVar3 = plVar8->frame_state;
        if (bVar3 != 9) break;
        uVar22 = plVar8->count;
        uVar12 = uVar22 + 1;
        plVar8->count = uVar12;
        bVar3 = plVar8->flags;
        uVar20 = (uint)bVar11;
        if (((bVar3 & 8) == 0) || ((*(ushort *)&plVar8->field_0xa8 & 0x40) != 0)) {
          if (((bVar3 & 0x20) == 0) || ((plVar8->field_0xa8 & 0x80) != 0)) {
            if ((plVar8->padding != 0) && (plVar8->length - (uint)plVar8->padding < uVar12)) {
              if (bVar11 == 0) goto LAB_00129f95;
              pcVar18 = "nonzero padding";
              goto LAB_00129eca;
            }
            switch((ulong)plVar8->type) {
            case 0:
              _lws_log(8,"%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n","lws_h2_parser");
              if (wsi->immortal_substream_count == '\0') {
                iVar13 = wsi->vhost->keepalive_timeout;
                if (iVar13 == 0) {
                  iVar13 = 0x1f;
                }
                lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar13);
              }
              if (plVar8->swsi != (lws *)0x0) {
                sVar16 = lws_buflist_next_segment_len(&plVar8->swsi->buflist,(uint8_t **)0x0);
                if (sVar16 != 0) {
                  _lws_log(8,"%s: substream has pending\n","lws_h2_parser");
                }
                plVar15 = plVar8->swsi;
                if ((plVar15->role_ops == &role_ops_h1 || plVar15->role_ops == &role_ops_h2) &&
                   ((short)plVar15->wsistate == 0x119)) {
                  lwsi_set_state(plVar15,0x17);
                  _lws_log(8,"%s: swsi %p to LRS_BODY\n","lws_h2_parser",plVar8->swsi);
                  plVar15 = plVar8->swsi;
                }
                iVar13 = lws_hdr_total_length(plVar15,WSI_TOKEN_HTTP_CONTENT_LENGTH);
                if ((((iVar13 == 0) || ((plVar8->swsi->http).rx_content_length == 0)) ||
                    (inlen <= (plVar8->swsi->http).rx_content_remain)) ||
                   (plVar8->length <= plVar8->inside)) {
                  uVar21 = (plVar8->length - plVar8->count) + 1;
                  if ((int)uVar26 < (int)uVar21) {
                    uVar21 = (int)uVar26 + 1;
                  }
                  else {
                    _lws_log(0x10,"---- restricting len to %d vs %ld\n",(ulong)uVar21,inlen);
                  }
                  plVar15 = plVar8->swsi;
                  sVar16 = (size_t)(int)uVar21;
                  if ((*(ulong *)&plVar15->field_0x2dc >> 0x37 & 1) == 0) {
                    if ((short)plVar15->wsistate == 0x110) {
                      iVar13 = lws_buflist_append_segment(&plVar15->buflist,pbVar25,sVar16);
                      if (iVar13 < 0) {
                        return -1;
                      }
                      if (iVar13 != 0) {
                        plVar10 = wsi->context;
                        cVar4 = wsi->tsi;
                        _lws_log(0x10,"%s: added %p to rxflow list\n","lws_h2_parser");
                        lws_dll2_add_head(&plVar8->swsi->dll_buflist,
                                          &plVar10->pt[cVar4].dll_buflist_owner);
                      }
                      plVar8->inside = plVar8->inside + uVar21;
                      iVar13 = uVar21 - 1;
                      plVar8->count = plVar8->count + iVar13;
                      _lws_log(0x10,"%s: deferred %d\n","lws_h2_parser",(ulong)uVar21);
                      plVar15 = plVar8->swsi;
                    }
                    else {
                      *(ulong *)&plVar15->field_0x2dc =
                           *(ulong *)&plVar15->field_0x2dc | 0x80000000000;
                      uVar21 = lws_read_h1(plVar8->swsi,pbVar25,sVar16);
                      puVar2 = &plVar8->swsi->field_0x2dc;
                      *(ulong *)puVar2 = *(ulong *)puVar2 & 0xfffff7ffffffffff;
                      if (((int)uVar21 < 0) ||
                         ((uVar21 == 0 &&
                          (sVar16 = lws_buflist_next_segment_len(&wsi->buflist,(uint8_t **)0x0),
                          sVar16 == 0)))) {
                        _lws_log(8,"%s: lws_read_h1 told %d %u / %u\n","lws_h2_parser",(ulong)uVar21
                                 ,(ulong)plVar8->count,(ulong)plVar8->length);
                        uVar23 = plVar8->length;
                        local_60 = local_60 + (uVar23 - plVar8->count);
                        plVar8->inside = uVar23;
                        plVar8->count = uVar23 - 1;
                        goto LAB_0012b0f5;
                      }
                      plVar8->inside = plVar8->inside + uVar21;
                      iVar13 = uVar21 - 1;
                      plVar8->count = plVar8->count + iVar13;
                      plVar15 = plVar8->swsi;
                      piVar1 = &(plVar15->txc).peer_tx_cr_est;
                      *piVar1 = *piVar1 - uVar21;
                      piVar1 = &(wsi->txc).peer_tx_cr_est;
                      *piVar1 = *piVar1 - uVar21;
                    }
                    local_60 = local_60 + iVar13;
                    uVar26 = uVar26 - (long)iVar13;
                    if ((plVar15->flags & 0x200) == 0) {
                      if ((plVar15->txc).peer_tx_cr_est <= (int)uVar21) {
                        lws_h2_update_peer_txcredit(plVar15,plVar8->sid,uVar21);
                      }
                    }
                    else {
                      lws_h2_update_peer_txcredit(wsi,0,uVar21);
                      (plVar8->swsi->txc).manual = '\x01';
                    }
                    goto LAB_00129f95;
                  }
                  if (plVar15->protocol == (lws_protocols *)0x0) {
                    bVar27 = false;
                    _lws_log(1,"%s: swsi %p doesn\'t have protocol\n","lws_h2_parser");
                  }
                  else {
                    piVar1 = &(plVar15->txc).peer_tx_cr_est;
                    *piVar1 = *piVar1 - uVar21;
                    piVar1 = &(wsi->txc).peer_tx_cr_est;
                    *piVar1 = *piVar1 - uVar21;
                    lws_wsi_txc_describe(&plVar15->txc,"lws_h2_parser",(plVar15->mux).my_sid);
                    plVar15 = plVar8->swsi;
                    iVar13 = user_callback_handle_rxflow
                                       (plVar15->protocol->callback,plVar15,
                                        LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,plVar15->user_space,
                                        pbVar25,sVar16);
                    bVar27 = iVar13 == 0;
                  }
                  local_60 = local_60 + (sVar16 - 1);
                  plVar8->inside = plVar8->inside + uVar21;
                  plVar8->count = (plVar8->count + uVar21) - 1;
                  if (bVar27) {
                    uVar26 = uVar26 - (sVar16 - 1);
                    goto LAB_00129f95;
                  }
                  _lws_log(8,"RECEIVE_CLIENT_HTTP closed it\n");
LAB_0012b0f5:
                  lws_close_free_wsi(plVar8->swsi,LWS_CLOSE_STATUS_NOSTATUS,"close_swsi_and_return")
                  ;
                  plVar8->swsi = (lws *)0x0;
                  plVar8->frame_state = '\0';
                  plVar8->count = 0;
                  iVar13 = 2;
                  pbVar25 = local_60;
                  goto LAB_0012afe0;
                }
                pcVar18 = "More rx than content_length told";
LAB_0012a40b:
                lws_h2_goaway(wsi,1,pcVar18);
              }
              break;
            case 1:
            case 9:
              if (plVar8->swsi != (lws *)0x0) {
                iVar13 = lws_hpack_interpret(plVar8->swsi,bVar11);
                if (iVar13 == 0) goto LAB_00129f95;
                _lws_log(8,"%s: hpack failed\n","lws_h2_parser");
                goto LAB_0012b041;
              }
              break;
            case 2:
              if (uVar12 < 5) {
                plVar8->dep = plVar8->dep << 8 | uVar21;
                break;
              }
              plVar8->weight_temp = bVar11;
              _lws_log(8,"PRIORITY: dep 0x%x, weight 0x%02X\n",(ulong)plVar8->dep,(ulong)bVar11);
              if ((plVar8->dep & 0x7fffffff) == plVar8->sid) {
                pcVar18 = "cant depend on own sid";
                goto LAB_0012a40b;
              }
              goto LAB_00129f95;
            case 3:
            case 8:
              plVar8->hpack_e_dep = plVar8->hpack_e_dep << 8 | uVar21;
              break;
            case 4:
              uVar24 = (ulong)(uVar22 - plVar8->preamble) % 6;
              plVar8->one_setting[uVar24] = bVar11;
              if ((int)uVar24 == 5) {
                lws_h2_settings(wsi,&plVar8->peer_set,plVar8->one_setting,6);
              }
              break;
            case 5:
            case 10:
              break;
            case 6:
              if ((bVar3 & 1) == 0) {
                if (8 < uVar12) {
                  return 1;
                }
                plVar8->ping_payload[uVar22] = bVar11;
                goto LAB_00129f95;
              }
              break;
            case 7:
              uVar22 = plVar8->inside;
              plVar8->inside = uVar22 + 1;
              if (3 < uVar22 - 4) {
                if (uVar22 < 4) {
                  plVar8->goaway_last_sid = plVar8->goaway_last_sid << 8 | uVar21;
                  plVar8->goaway_str[0] = '\0';
                }
                else {
                  if (uVar22 - 8 < 0x1f) {
                    plVar8->goaway_str[uVar22 - 8] = bVar11;
                  }
                  plVar8->goaway_str[0x1f] = '\0';
                }
                goto LAB_00129f95;
              }
              plVar8->goaway_err = plVar8->goaway_err << 8 | uVar21;
              break;
            default:
              _lws_log(4,"%s: unhandled frame type %d\n","lws_h2_parser",(ulong)plVar8->type);
LAB_0012b041:
              iVar13 = 1;
              pbVar25 = local_60;
              goto LAB_0012afe0;
            }
LAB_00129f95:
            pbVar25 = local_60;
            if (plVar8->count <= plVar8->length) goto code_r0x00129fac;
            _lws_log(4,"%s: count > length %u %u\n","lws_h2_parser");
            goto LAB_0012afd3;
          }
          _lws_log(0x10,"PRIORITY FLAG:  0x%x\n",(ulong)uVar20);
          uVar23 = plVar8->preamble;
          plVar8->preamble = uVar23 + 1;
          if (uVar23 - ((*(ushort *)&plVar8->field_0xa8 >> 6 & 1) != 0) < 4) {
            plVar8->dep = plVar8->dep << 8 | uVar20;
            inlen = uVar26;
            pbVar25 = local_60;
          }
          else {
            plVar8->weight_temp = bVar11;
            *(ushort *)&plVar8->field_0xa8 = *(ushort *)&plVar8->field_0xa8 | 0x80;
            _lws_log(0x10,"PRI FL: dep 0x%x, weight 0x%02X\n",(ulong)plVar8->dep,(ulong)uVar20);
            inlen = uVar26;
            pbVar25 = local_60;
          }
        }
        else {
          plVar8->padding = bVar11;
          *(ushort *)&plVar8->field_0xa8 = *(ushort *)&plVar8->field_0xa8 | 0x40;
          plVar8->preamble = plVar8->preamble + 1;
          inlen = uVar26;
          pbVar25 = local_60;
          if (plVar8->length - 1 < uVar20) {
            pcVar18 = "execssive padding";
LAB_00129eca:
            lws_h2_goaway(wsi,1,pcVar18);
            inlen = uVar26;
            pbVar25 = local_60;
          }
        }
      }
      inlen = uVar26;
      pbVar25 = local_60;
    } while (8 < bVar3);
    plVar8->frame_state = bVar3 + 1;
    switch(bVar3) {
    case 0:
      plVar8->field_0xa8 = plVar8->field_0xa8 & 0x3f;
      plVar8->padding = '\0';
      plVar8->preamble = 0;
      plVar8->length = uVar21;
      plVar8->inside = 0;
      goto LAB_00129c34;
    case 1:
    case 2:
      plVar8->length = plVar8->length << 8 | uVar21;
      goto LAB_00129c34;
    case 3:
      plVar8->type = bVar11;
      goto LAB_00129c34;
    case 4:
      plVar8->flags = bVar11;
      goto LAB_00129c34;
    }
    plVar8->sid = plVar8->sid << 8 | uVar21;
  } while ((byte)(bVar3 + 1) != '\t');
  plVar9 = (wsi->h2).h2n;
  plVar9->count = 0;
  plVar9->swsi = wsi;
  uVar21 = plVar9->sid;
  uVar22 = uVar21 & 0x7fffffff;
  plVar9->sid = uVar22;
  if ((uVar21 & 1) == 0 && uVar22 != 0) {
    pcVar18 = "Even Stream ID";
    goto LAB_00129eca;
  }
  if (wsi->immortal_substream_count == '\0') {
    iVar13 = wsi->vhost->keepalive_timeout;
    if (iVar13 == 0) {
      iVar13 = 0x1f;
    }
    lws_set_timeout(wsi,PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,iVar13);
    uVar22 = plVar9->sid;
  }
  if (uVar22 == 0) {
    plVar15 = plVar9->swsi;
    uVar24 = 0;
  }
  else {
    plVar15 = lws_wsi_mux_from_id(wsi,uVar22);
    plVar9->swsi = plVar15;
    uVar24 = (ulong)plVar9->sid;
  }
  _lws_log(0x10,"%p (%p): fr hdr: typ 0x%x, fla 0x%x, sid 0x%x, len 0x%x\n",wsi,plVar15,
           (ulong)plVar9->type,(ulong)plVar9->flags,uVar24,(ulong)plVar9->length);
  if (((plVar9->field_0xa8 & 0x20) != 0) && (plVar9->highest_sid < plVar9->sid)) {
    plVar9->type = '\n';
    goto LAB_00129c34;
  }
  bVar11 = plVar9->type;
  uVar24 = (ulong)bVar11;
  if (bVar11 == 10) goto LAB_00129c34;
  if ((plVar9->our_set).s[5] < plVar9->length) {
    _lws_log(8,"%s: received oversize frame %d\n","lws_h2_parse_frame_header");
    lws_h2_goaway(wsi,6,"Peer ignored our frame size setting");
    goto LAB_0012afd3;
  }
  plVar15 = plVar9->swsi;
  if (plVar15 == (lws *)0x0) {
    uVar21 = plVar9->sid;
    if (bVar11 == 0) {
      if ((plVar9->highest_sid_opened < uVar21) || ((wsi->field_0x2e2 & 0x40) == 0))
      goto LAB_0012a920;
      _lws_log(4,"ignoring straggling data fl 0x%x\n",(ulong)plVar9->flags);
      plVar9->type = '\n';
      uVar21 = plVar9->sid;
      plVar15 = plVar9->swsi;
      uVar24 = 10;
      if (plVar9->highest_sid_opened < uVar21) goto LAB_0012a5bb;
      goto LAB_0012a361;
    }
    bVar27 = true;
    plVar15 = (lws *)0x0;
    plVar17 = (lws *)0x0;
    if (bVar11 < 3 || uVar21 <= plVar9->highest_sid_opened) goto LAB_0012a6ac;
LAB_0012a5bb:
    _lws_log(8,"%s: wsi %p, No child for sid %d, rxcmd %d\n","lws_h2_parse_frame_header",plVar15,
             (ulong)uVar21,uVar24);
LAB_0012a920:
    uVar23 = 5;
    pcVar18 = "Data for nonexistent sid";
LAB_0012a97f:
    lws_h2_goaway(wsi,uVar23,pcVar18);
    goto LAB_00129c34;
  }
  _lws_log(8,"%s: wsi %p, State: %s, received cmd %d\n","lws_h2_parse_frame_header",plVar15,
           h2_state_names[(plVar15->h2).h2_state]);
  plVar15 = plVar9->swsi;
LAB_0012a361:
  if (plVar15 == (lws *)0x0) {
    bVar27 = true;
    plVar17 = (lws *)0x0;
  }
  else {
    if (plVar9->sid != 0) {
      bVar11 = (plVar15->h2).h2_state;
      if ((http2_rx_validity[bVar11] >> (plVar9->type & 0x1f) & 1) == 0) {
        _lws_log(8,"%s: wsi %p, State: %s, ILLEGAL cmdrx %d (OK 0x%x)\n","lws_h2_parse_frame_header"
                 ,plVar15,h2_state_names[bVar11],(ulong)plVar9->type,
                 (ulong)http2_rx_validity[bVar11]);
        uVar23 = (uint)(((plVar9->swsi->h2).h2_state & 0xfd) == 4) * 4 + 1;
        pcVar18 = "invalid rx for state";
        goto LAB_0012a97f;
      }
    }
    bVar27 = false;
    plVar17 = plVar15;
  }
LAB_0012a6ac:
  if ((*(ushort *)&plVar9->field_0xa8 & 8) != 0) {
    uVar21 = plVar9->cont_exp_sid;
    uVar19 = (ulong)uVar21;
    uVar24 = uVar19;
    if (uVar21 != plVar9->sid || plVar9->type != 9) {
      _lws_log(8,"%s: expected cont on sid %u (got %d on sid %u)\n","lws_h2_parse_frame_header",
               (ulong)uVar21,(ulong)plVar9->type);
      uVar6 = *(ushort *)&plVar9->field_0xa8;
      *(ushort *)&plVar9->field_0xa8 = uVar6 & 0xfff7;
      uVar23 = ((uVar6 & 0x10) >> 1) + 1;
      pcVar18 = "Continuation hdrs State";
      goto LAB_0012a97f;
    }
LAB_0012a7a0:
    _lws_log(8,"LWS_H2_FRAME_TYPE_CONTINUATION: sid = %u %d %d\n",uVar19,
             (ulong)(*(ushort *)&plVar9->field_0xa8 >> 3 & 1),uVar24);
    if ((((plVar9->field_0xa8 & 8) == 0) ||
        (plVar9->sid == 0 || plVar9->cont_exp_sid != plVar9->sid)) ||
       (plVar15 = plVar9->swsi, plVar15 == (lws *)0x0)) {
      uVar23 = 1;
      pcVar18 = "unexpected CONTINUATION";
      goto LAB_0012a901;
    }
    if (((plVar15->h2).field_0x11 & 2) != 0) {
      uVar23 = 1;
      pcVar18 = "END_HEADERS already seen";
      goto LAB_0012af73;
    }
LAB_0012aeb6:
    (plVar15->h2).field_0x11 = (plVar15->h2).field_0x11 & 0xfd | plVar9->flags >> 1 & 2;
    _lws_log(8,"%p: END_HEADERS %d\n",plVar9->swsi,
             (ulong)((byte)(plVar9->swsi->h2).field_0x11 >> 1 & 1));
    bVar11 = (plVar9->swsi->h2).field_0x11;
    if ((bVar11 & 2) != 0) {
      plVar9->field_0xa8 = plVar9->field_0xa8 & 0xf7;
      bVar11 = (plVar9->swsi->h2).field_0x11;
    }
    _lws_log(0x10,"END_HEADERS %d\n",(ulong)(bVar11 >> 1 & 1));
    goto switchD_0012a6db_caseD_a;
  }
  switch((ulong)plVar9->type) {
  case 0:
    _lws_log(8,"seen incoming LWS_H2_FRAME_TYPE_DATA start\n");
    if (plVar9->sid != 0) {
      _lws_log(8,"Frame header DATA: sid %u, flags 0x%x, len %u\n",(ulong)plVar9->sid,
               (ulong)plVar9->flags,(ulong)plVar9->length);
      if (plVar9->swsi == (lws *)0x0) {
        iVar13 = 4;
        pcVar18 = "DATA: NULL swsi\n";
        goto LAB_0012ab61;
      }
      _lws_log(8,"DATA rx on state %d\n",(ulong)(plVar9->swsi->h2).h2_state);
      if (((plVar9->swsi->h2).h2_state | 2) == 6) {
        uVar23 = 5;
        pcVar18 = "conn closed";
        goto LAB_0012a901;
      }
      if (plVar9->length == 0) {
        lws_h2_parse_end_of_frame(wsi);
        break;
      }
      goto LAB_00129c34;
    }
    _lws_log(8,"DATA: 0 sid\n");
    uVar23 = 1;
    pcVar18 = "DATA 0 sid";
    goto LAB_0012a901;
  case 1:
    _lws_log(8,"HEADERS: frame header: sid = %u\n",(ulong)plVar9->sid);
    uVar21 = plVar9->sid;
    if (uVar21 == 0) {
      pcVar18 = "sid 0";
LAB_0012b176:
      lws_h2_goaway(wsi,1,pcVar18);
      goto LAB_0012b041;
    }
    plVar15 = plVar9->swsi;
    if (plVar15 == (lws *)0x0) {
      if ((wsi->field_0x2e2 & 0x40) == 0) {
        if ((((wsi->h2).h2n)->our_set).s[3] < (wsi->mux).child_count + 1) {
          pcVar18 = "Another stream not allowed";
        }
        else {
          plVar15 = lws_wsi_server_new(wsi->vhost,wsi,uVar21);
          plVar9->swsi = plVar15;
          if (plVar15 != (lws *)0x0) {
            puVar2 = &(plVar15->h2).field_0x11;
            *puVar2 = *puVar2 | 0x10;
            iVar13 = lws_h2_update_peer_txcredit(plVar9->swsi,(plVar9->swsi->mux).my_sid,0x40000);
            if (iVar13 != 0) goto LAB_0012b041;
            plVar15 = plVar9->swsi;
            goto LAB_0012ad33;
          }
          pcVar18 = "OOM";
        }
        goto LAB_0012b176;
      }
LAB_0012ad9e:
      plVar15 = lws_wsi_mux_from_id(wsi,uVar21);
      plVar9->swsi = plVar15;
      _lws_log(8,"HEADERS: nwsi %p: sid %u mapped to wsi %p\n",wsi,(ulong)plVar9->sid,plVar15);
      plVar15 = plVar9->swsi;
      if (plVar15 == (lws *)0x0) break;
    }
    else {
      if ((((plVar15->h2).field_0x11 & 3) == 2) && ((plVar9->flags & 1) == 0)) {
        pcVar18 = "extra HEADERS together";
        goto LAB_0012b176;
      }
      if ((wsi->field_0x2e2 & 0x40) != 0) goto LAB_0012ad9e;
LAB_0012ad33:
      if (((plVar15->http).ah == (allocated_headers *)0x0) &&
         (iVar13 = lws_header_table_attach(plVar15,0), iVar13 != 0)) {
        _lws_log(1,"%s: Failed to get ah\n","lws_h2_parse_frame_header");
        goto LAB_0012b041;
      }
      plVar15 = (wsi->mux).child_list;
      while (plVar15 != (lws *)0x0) {
        if (((plVar15->mux).my_sid < plVar9->sid) && ((plVar15->h2).h2_state == '\0')) {
          lws_close_free_wsi(plVar15,LWS_CLOSE_STATUS_NOSTATUS,"h2 sid close");
        }
        plVar17 = (plVar15->mux).sibling_list;
        bVar27 = plVar17 == plVar15;
        plVar15 = plVar17;
        if (bVar27) {
          __assert_fail("w->mux.sibling_list != w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/h2/http2.c"
                        ,0x4e5,"int lws_h2_parse_frame_header(struct lws *)");
        }
      }
      plVar15 = plVar9->swsi;
      if ((plVar15->vhost->options & 0x100000000) == 0) {
        (plVar15->h2).field_0x11 = (plVar15->h2).field_0x11 & 0xfe | plVar9->flags & 1;
        _lws_log(0x10,"%s: hdr END_STREAM = %d\n","lws_h2_parse_frame_header",
                 (ulong)((byte)(plVar9->swsi->h2).field_0x11 & 1));
      }
      else {
        lws_mux_mark_immortal(plVar15);
        _lws_log(8,"%s: %p: h2 stream entering long poll\n","lws_h2_parse_frame_header",plVar9->swsi
                );
      }
      uVar7._0_1_ = plVar9->flags;
      uVar7._1_1_ = plVar9->padding;
      uVar7._2_1_ = plVar9->weight_temp;
      uVar7._3_1_ = plVar9->huff_pad;
      plVar9->cont_exp_sid = plVar9->sid;
      *(ushort *)&plVar9->field_0xa8 =
           ((ushort)*(undefined4 *)&plVar9->field_0xa8 & 0xffe7) + (~(ushort)uVar7 & 4) * 2 + 0x10;
      plVar15 = plVar9->swsi;
    }
    goto LAB_0012aeb6;
  case 2:
    _lws_log(8,"LWS_H2_FRAME_TYPE_PRIORITY complete frame\n");
    if (plVar9->sid != 0) {
      if (plVar9->length != 5) {
        uVar23 = 6;
        pcVar18 = "Priority has length other than 5";
        goto LAB_0012af73;
      }
      goto LAB_00129c34;
    }
    uVar23 = 1;
    pcVar18 = "Priority has 0 sid";
LAB_0012a901:
    lws_h2_goaway(wsi,uVar23,pcVar18);
    break;
  case 3:
    if (plVar9->sid == 0) goto LAB_0012b041;
    if (bVar27) {
      if (plVar9->highest_sid_opened < plVar9->sid) {
        pcVar18 = "crazy sid on RST_STREAM";
        goto LAB_0012b176;
      }
    }
    else {
      uVar23 = 6;
      if (plVar9->length != 4) {
        pcVar18 = "RST_STREAM can only be length 4";
        goto LAB_0012af73;
      }
      lws_h2_state(plVar17,LWS_H2_STATE_CLOSED);
    }
    break;
  case 4:
    _lws_log(8,"LWS_H2_FRAME_TYPE_SETTINGS complete frame\n");
    if (plVar9->sid != 0) {
      uVar23 = 1;
      pcVar18 = "Settings has nonzero sid";
      goto LAB_0012a901;
    }
    uVar21 = plVar9->length;
    if ((plVar9->flags & 1) != 0) {
      if (uVar21 != 0) {
        uVar23 = 6;
        pcVar18 = "Settings with ACK not allowed payload";
        goto LAB_0012af73;
      }
      goto LAB_0012af94;
    }
    uVar23 = 6;
    if ((uVar21 == 0) || (uVar21 % 6 != 0)) {
      pcVar18 = "Settings length error";
      goto LAB_0012af73;
    }
    if (plVar9->type != '\n') {
      if (((*(ulong *)&wsi->field_0x2dc & 4) != 0) &&
         (((*(ulong *)&wsi->field_0x2dc & 0x40) == 0 || ((wsi->flags & 0x20U) == 0)))) {
        plVar14 = lws_h2_new_pps(LWS_H2_PPS_ACK_SETTINGS);
        if (plVar14 == (lws_h2_protocol_send *)0x0) goto LAB_0012b041;
        lws_pps_schedule(wsi,plVar14);
        wsi->field_0x2dc = wsi->field_0x2dc | 0x40;
      }
      break;
    }
    goto LAB_00129c34;
  case 5:
    _lws_log(8,"LWS_H2_FRAME_TYPE_PUSH_PROMISE complete frame\n");
    uVar23 = 1;
    pcVar18 = "Server only";
    goto LAB_0012af73;
  case 6:
    if (plVar9->sid == 0) {
      if (plVar9->length == 8) goto LAB_00129c34;
      uVar23 = 6;
      pcVar18 = "Ping payload can only be 8";
    }
    else {
      uVar23 = 1;
      pcVar18 = "Ping has nonzero sid";
    }
LAB_0012af73:
    lws_h2_goaway(wsi,uVar23,pcVar18);
    break;
  case 7:
    iVar13 = 0x10;
    pcVar18 = "LWS_H2_FRAME_TYPE_GOAWAY received\n";
    goto LAB_0012ab61;
  case 8:
    if (plVar9->length != 4) {
      uVar23 = 6;
      pcVar18 = "window update frame not 4";
      goto LAB_0012af73;
    }
    iVar13 = 8;
    pcVar18 = "LWS_H2_FRAME_TYPE_WINDOW_UPDATE\n";
LAB_0012ab61:
    _lws_log(iVar13,pcVar18);
    break;
  case 9:
    uVar19 = (ulong)plVar9->sid;
    uVar24 = (ulong)plVar9->cont_exp_sid;
    goto LAB_0012a7a0;
  case 10:
    break;
  default:
    _lws_log(8,"%s: ILLEGAL FRAME TYPE %d\n","lws_h2_parse_frame_header",(ulong)plVar9->type);
    plVar9->type = '\n';
  }
switchD_0012a6db_caseD_a:
  if (plVar9->length == 0) {
LAB_0012af94:
    plVar9->frame_state = '\0';
  }
  goto LAB_00129c34;
code_r0x00129fac:
  inlen = uVar26;
  if ((plVar8->count != plVar8->length) || (iVar13 = lws_h2_parse_end_of_frame(wsi), iVar13 == 0))
  goto LAB_00129c34;
LAB_0012afd3:
  iVar13 = 1;
LAB_0012afe0:
  *inused = (long)pbVar25 - (long)in;
  return iVar13;
}

Assistant:

int
lws_h2_parser(struct lws *wsi, unsigned char *in, lws_filepos_t inlen,
	      lws_filepos_t *inused)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;
	unsigned char c, *oldin = in;
	int n, m;

	if (!h2n)
		goto fail;

	while (inlen--) {

		c = *in++;

		// lwsl_notice("%s: 0x%x\n", __func__, c);

		switch (lwsi_state(wsi)) {
		case LRS_H2_AWAIT_PREFACE:
			if (preface[h2n->count++] != c)
				goto fail;

			if (preface[h2n->count])
				break;

			lwsl_info("http2: %p: established\n", wsi);
			lwsi_set_state(wsi, LRS_H2_AWAIT_SETTINGS);
			lws_validity_confirmed(wsi);
			h2n->count = 0;
			wsi->txc.tx_cr = 65535;

			/*
			 * we must send a settings frame -- empty one is OK...
			 * that must be the first thing sent by server
			 * and the peer must send a SETTINGS with ACK flag...
			 */
			pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
			if (!pps)
				goto fail;
			lws_pps_schedule(wsi, pps);
			break;

		case LRS_H2_WAITING_TO_SEND_HEADERS:
		case LRS_ESTABLISHED:
		case LRS_H2_AWAIT_SETTINGS:
			if (h2n->frame_state != LWS_H2_FRAME_HEADER_LENGTH)
				goto try_frame_start;

			/*
			 * post-header, preamble / payload / padding part
			 */
			h2n->count++;

			if (h2n->flags & LWS_H2_FLAG_PADDED &&
			    !h2n->pad_length) {
				/*
				 * Get the padding count... actual padding is
				 * at the end of the frame.
				 */
				h2n->padding = c;
				h2n->pad_length = 1;
				h2n->preamble++;

				if (h2n->padding > h2n->length - 1)
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
						      "execssive padding");
				break; /* we consumed this */
			}

			if (h2n->flags & LWS_H2_FLAG_PRIORITY &&
			    !h2n->collected_priority) {
				/* going to be 5 preamble bytes */

				lwsl_debug("PRIORITY FLAG:  0x%x\n", c);

				if (h2n->preamble++ - h2n->pad_length < 4) {
					h2n->dep = ((h2n->dep) << 8) | c;
					break; /* we consumed this */
				}
				h2n->weight_temp = c;
				h2n->collected_priority = 1;
				lwsl_debug("PRI FL: dep 0x%x, weight 0x%02X\n",
					   (unsigned int)h2n->dep,
					   h2n->weight_temp);
				break; /* we consumed this */
			}
			if (h2n->padding && h2n->count >
			    (h2n->length - h2n->padding)) {
				if (c) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "nonzero padding");
					break;
				}
				goto frame_end;
			}

			/* applies to wsi->h2.swsi which may be wsi */
			switch(h2n->type) {

			case LWS_H2_FRAME_TYPE_SETTINGS:
				n = (h2n->count - 1 - h2n->preamble) %
				     LWS_H2_SETTINGS_LEN;
				h2n->one_setting[n] = c;
				if (n != LWS_H2_SETTINGS_LEN - 1)
					break;
				lws_h2_settings(wsi, &h2n->peer_set,
						h2n->one_setting,
						LWS_H2_SETTINGS_LEN);
				break;

			case LWS_H2_FRAME_TYPE_CONTINUATION:
			case LWS_H2_FRAME_TYPE_HEADERS:
				if (!h2n->swsi)
					break;
				if (lws_hpack_interpret(h2n->swsi, c)) {
					lwsl_info("%s: hpack failed\n",
						  __func__);
					goto fail;
				}
				break;

			case LWS_H2_FRAME_TYPE_GOAWAY:
				switch (h2n->inside++) {
				case 0:
				case 1:
				case 2:
				case 3:
					h2n->goaway_last_sid <<= 8;
					h2n->goaway_last_sid |= c;
					h2n->goaway_str[0] = '\0';
					break;

				case 4:
				case 5:
				case 6:
				case 7:
					h2n->goaway_err <<= 8;
					h2n->goaway_err |= c;
					break;

				default:
					if (h2n->inside - 9 <
					    sizeof(h2n->goaway_str) - 1)
						h2n->goaway_str[
						           h2n->inside - 9] = c;
					h2n->goaway_str[
					    sizeof(h2n->goaway_str) - 1] = '\0';
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_DATA:

				lwsl_info("%s: LWS_H2_FRAME_TYPE_DATA: fl 0x%x\n",
					  __func__, h2n->flags);

				/*
				 * let the network wsi live a bit longer if
				 * subs are active... our frame may take a long
				 * time to chew through
				 */
				if (!wsi->immortal_substream_count)
					lws_set_timeout(wsi,
					PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE,
						wsi->vhost->keepalive_timeout ?
					    wsi->vhost->keepalive_timeout : 31);

				if (!h2n->swsi)
					break;

				if (lws_buflist_next_segment_len(
						&h2n->swsi->buflist, NULL))
					lwsl_info("%s: substream has pending\n",
						  __func__);

				if (lwsi_role_http(h2n->swsi) &&
				    lwsi_state(h2n->swsi) == LRS_ESTABLISHED) {
					lwsi_set_state(h2n->swsi, LRS_BODY);
					lwsl_info("%s: swsi %p to LRS_BODY\n",
							__func__, h2n->swsi);
				}

				if (lws_hdr_total_length(h2n->swsi,
					     WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
				    h2n->swsi->http.rx_content_length &&
				    h2n->swsi->http.rx_content_remain <
						    inlen + 1 && /* last */
				    h2n->inside < h2n->length) {
					/* unread data in frame */
					lws_h2_goaway(wsi,
						      H2_ERR_PROTOCOL_ERROR,
					    "More rx than content_length told");
					break;
				}

				/*
				 * We operate on a frame.  The RX we have at
				 * hand may exceed the current frame.
				 */

				n = (int)inlen + 1;
				if (n > (int)(h2n->length - h2n->count + 1)) {
					n = h2n->length - h2n->count + 1;
					lwsl_debug("---- restricting len to %d "
						   "vs %ld\n", n, (long)inlen + 1);
				}
#if defined(LWS_WITH_CLIENT)
				if (h2n->swsi->client_mux_substream) {
					if (!h2n->swsi->protocol) {
						lwsl_err("%s: swsi %p doesn't have protocol\n",
							 __func__, h2n->swsi);
						m = 1;
					} else {
						h2n->swsi->txc.peer_tx_cr_est -= n;
						wsi->txc.peer_tx_cr_est -= n;
						lws_wsi_txc_describe(&h2n->swsi->txc,
							__func__,
							h2n->swsi->mux.my_sid);
					m = user_callback_handle_rxflow(
						h2n->swsi->protocol->callback,
						h2n->swsi,
					  LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
						h2n->swsi->user_space,
						in - 1, n);
					}

					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					if (m) {
						lwsl_info("RECEIVE_CLIENT_HTTP "
							  "closed it\n");
						goto close_swsi_and_return;
					}

					break;
				}
#endif

				if (lwsi_state(h2n->swsi) == LRS_DEFERRING_ACTION) {
					m = lws_buflist_append_segment(
						&h2n->swsi->buflist, in - 1, n);
					if (m < 0)
						return -1;
					if (m) {
						struct lws_context_per_thread *pt;

						pt = &wsi->context->pt[(int)wsi->tsi];
						lwsl_debug("%s: added %p to rxflow list\n",
							   __func__, wsi);
						lws_dll2_add_head(
							&h2n->swsi->dll_buflist,
							&pt->dll_buflist_owner);
					}
					in += n - 1;
					h2n->inside += n;
					h2n->count += n - 1;
					inlen -= n - 1;

					lwsl_debug("%s: deferred %d\n", __func__, n);
					goto do_windows;
				}

				h2n->swsi->outer_will_close = 1;
				/*
				 * choose the length for this go so that we end at
				 * the frame boundary, in the case there is already
				 * more waiting leave it for next time around
				 */

				n = lws_read_h1(h2n->swsi, in - 1, n);
				// lwsl_notice("%s: lws_read_h1 %d\n", __func__, n);
				h2n->swsi->outer_will_close = 0;
				/*
				 * can return 0 in POST body with
				 * content len exhausted somehow.
				 */
				if (n < 0 ||
				    (!n && !lws_buflist_next_segment_len(
						    &wsi->buflist, NULL))) {
					lwsl_info("%s: lws_read_h1 told %d %u / %u\n",
						__func__, n,
						(unsigned int)h2n->count,
						(unsigned int)h2n->length);
					in += h2n->length - h2n->count;
					h2n->inside = h2n->length;
					h2n->count = h2n->length - 1;

					//if (n < 0)
					//	goto already_closed_swsi;
					goto close_swsi_and_return;
				}

				inlen -= n - 1;
				in += n - 1;
				h2n->inside += n;
				h2n->count += n - 1;
				h2n->swsi->txc.peer_tx_cr_est -= n;
				wsi->txc.peer_tx_cr_est -= n;

do_windows:

#if defined(LWS_WITH_CLIENT)
				if (!(h2n->swsi->flags & LCCSCF_H2_MANUAL_RXFLOW))
#endif
				{
					/*
					 * The default behaviour is we just keep
					 * cranking the other side's tx credit
					 * back up, for simple bulk transfer as
					 * fast as we can take it
					 */

					m = n; //(2 * h2n->length) + 65536;

					/* update both the stream and nwsi */

					lws_h2_update_peer_txcredit_thresh(h2n->swsi,
								    h2n->sid, m, m);
				}
#if defined(LWS_WITH_CLIENT)
				else {
					/*
					 * If he's handling it himself, only
					 * repair the nwsi credit but allow the
					 * stream credit to run down until the
					 * user code deals with it
					 */
					lws_h2_update_peer_txcredit(wsi, 0, n);
					h2n->swsi->txc.manual = 1;
				}
#endif
				break;

			case LWS_H2_FRAME_TYPE_PRIORITY:
				if (h2n->count <= 4) {
					h2n->dep <<= 8;
					h2n->dep |= c;
					break;
				}
				h2n->weight_temp = c;
				lwsl_info("PRIORITY: dep 0x%x, weight 0x%02X\n",
					  (unsigned int)h2n->dep, h2n->weight_temp);

				if ((h2n->dep & ~(1u << 31)) == h2n->sid) {
					lws_h2_goaway(wsi, H2_ERR_PROTOCOL_ERROR,
						      "cant depend on own sid");
					break;
				}
				break;

			case LWS_H2_FRAME_TYPE_RST_STREAM:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_PUSH_PROMISE:
				break;

			case LWS_H2_FRAME_TYPE_PING:
				if (h2n->flags & LWS_H2_FLAG_SETTINGS_ACK) { // ack
				} else { /* they're sending us a ping request */
					if (h2n->count > 8)
						return 1;
					h2n->ping_payload[h2n->count - 1] = c;
				}
				break;

			case LWS_H2_FRAME_TYPE_WINDOW_UPDATE:
				h2n->hpack_e_dep <<= 8;
				h2n->hpack_e_dep |= c;
				break;

			case LWS_H2_FRAME_TYPE_COUNT: /* IGNORING FRAME */
				break;

			default:
				lwsl_notice("%s: unhandled frame type %d\n",
					    __func__, h2n->type);

				goto fail;
			}

frame_end:
			if (h2n->count > h2n->length) {
				lwsl_notice("%s: count > length %u %u\n",
					    __func__, (unsigned int)h2n->count,
					    (unsigned int)h2n->length);
				goto fail;
			}
			if (h2n->count != h2n->length)
				break;

			/*
			 * end of frame just happened
			 */
			if (lws_h2_parse_end_of_frame(wsi))
				goto fail;

			break;

try_frame_start:
			if (h2n->frame_state <= 8) {

				switch (h2n->frame_state++) {
				case 0:
					h2n->pad_length = 0;
					h2n->collected_priority = 0;
					h2n->padding = 0;
					h2n->preamble = 0;
					h2n->length = c;
					h2n->inside = 0;
					break;
				case 1:
				case 2:
					h2n->length <<= 8;
					h2n->length |= c;
					break;
				case 3:
					h2n->type = c;
					break;
				case 4:
					h2n->flags = c;
					break;

				case 5:
				case 6:
				case 7:
				case 8:
					h2n->sid <<= 8;
					h2n->sid |= c;
					break;
				}
			}

			if (h2n->frame_state == LWS_H2_FRAME_HEADER_LENGTH)
				if (lws_h2_parse_frame_header(wsi))
					goto fail;
			break;

		default:
			break;
		}
	}

	*inused = in - oldin;

	return 0;

close_swsi_and_return:

	lws_close_free_wsi(h2n->swsi, 0, "close_swsi_and_return");
	h2n->swsi = NULL;
	h2n->frame_state = 0;
	h2n->count = 0;

// already_closed_swsi:
	*inused = in - oldin;

	return 2;

fail:
	*inused = in - oldin;

	return 1;
}

#if defined(LWS_WITH_CLIENT)
int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI);
	struct lws *nwsi = lws_get_network_wsi(wsi);
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	nwsi->h2.h2n->highest_sid_opened = sid;
	wsi->mux.my_sid = sid;

	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)uri,
				lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_ORIGIN),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)lws_hdr_simple_ptr(wsi,
						_WSI_TOKEN_CLIENT_HOST),
			lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST),
				&p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_USER_AGENT,
				(unsigned char *)"lwsss", 5,
				&p, end))
		goto fail_length;

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, (end - p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

#if defined(LWS_WITH_DETAILED_LATENCY)
	wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, p - start, m);

	if (n != (p - start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}
#endif

int
lws_h2_ws_handshake(struct lws *wsi)
{
	uint8_t buf[LWS_PRE + 2048], *p = buf + LWS_PRE, *start = p,
		*end = &buf[sizeof(buf) - 1];
	const struct lws_http_mount *hit;
	const char * uri_ptr;
	int n, m;

	if (lws_add_http_header_status(wsi, HTTP_STATUS_OK, &p, end))
		return -1;

	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) > 64)
		return -1;

	if (wsi->proxied_ws_parent && wsi->child_list) {
		if (lws_hdr_simple_ptr(wsi, WSI_TOKEN_PROTOCOL)) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(uint8_t *)lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL),
				(int)strlen(lws_hdr_simple_ptr(wsi,
							   WSI_TOKEN_PROTOCOL)),
						 &p, end))
			return -1;
		}
	} else {

		/* we can only return the protocol header if:
		 *  - one came in, and ... */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
		    /*  - it is not an empty string */
		    wsi->protocol->name && wsi->protocol->name[0]) {
			if (lws_add_http_header_by_token(wsi, WSI_TOKEN_PROTOCOL,
				(unsigned char *)wsi->protocol->name,
				(int)strlen(wsi->protocol->name), &p, end))
			return -1;
		}
	}

	if (lws_finalize_http_header(wsi, &p, end))
		return -1;

	m = lws_ptr_diff(p, start);
	// lwsl_hexdump_notice(start, m);
	n = lws_write(wsi, start, m, LWS_WRITE_HTTP_HEADERS);
	if (n != m) {
		lwsl_err("_write returned %d from %d\n", n, m);

		return -1;
	}

	/*
	 * alright clean up, set our state to generic ws established, the
	 * mode / state of the nwsi will get the h2 processing done.
	 */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = 0; // ==LWS_RXPS_NEW;

	uri_ptr = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	n = lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_COLON_PATH);
	hit = lws_find_mount(wsi, uri_ptr, n);

	if (hit && hit->cgienv &&
	    wsi->protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO, wsi->user_space,
				    (void *)hit->cgienv, 0))
		return 1;

	lws_validity_confirmed(wsi);

	return 0;
}

int
lws_read_h2(struct lws *wsi, unsigned char *buf, lws_filepos_t len)
{
	unsigned char *oldbuf = buf;
	lws_filepos_t body_chunk_len;

	// lwsl_notice("%s: h2 path: wsistate 0x%x len %d\n", __func__,
	//		wsi->wsistate, (int)len);

	/*
	 * wsi here is always the network connection wsi, not a stream
	 * wsi.  Once we unpicked the framing we will find the right
	 * swsi and make it the target of the frame.
	 *
	 * If it's ws over h2, the nwsi will get us here to do the h2
	 * processing, and that will call us back with the swsi +
	 * ESTABLISHED state for the inner payload, handled in a later
	 * case.
	 */
	while (len) {
		int m;

		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (lws_is_flowcontrolled(wsi)) {
			lws_rxflow_cache(wsi, buf, 0, (int)len);
			buf += len;
			break;
		}

		/*
		 * lws_h2_parser() may send something; when it gets the
		 * whole frame, it will want to perform some action
		 * involving a reply.  But we may be in a partial send
		 * situation on the network wsi...
		 *
		 * Even though we may be in a partial send and unable to
		 * send anything new, we still have to parse the network
		 * wsi in order to gain tx credit to send, which is
		 * potentially necessary to clear the old partial send.
		 *
		 * ALL network wsi-specific frames are sent by PPS
		 * already, these are sent as a priority on the writable
		 * handler, and so respect partial sends.  The only
		 * problem is when a stream wsi wants to send an, eg,
		 * reply headers frame in response to the parsing
		 * we will do now... the *stream wsi* must stall in a
		 * different state until it is able to do so from a
		 * priority on the WRITABLE callback, same way that
		 * file transfers operate.
		 */

		m = lws_h2_parser(wsi, buf, len, &body_chunk_len);
		if (m && m != 2) {
			lwsl_debug("%s: http2_parser bail: %d\n", __func__, m);
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "lws_read_h2 bail");

			return -1;
		}
		if (m == 2) {
			/* swsi has been closed */
			buf += body_chunk_len;
			break;
		}

		buf += body_chunk_len;
		len -= body_chunk_len;
	}

	return lws_ptr_diff(buf, oldbuf);
}

int
lws_h2_client_stream_long_poll_rxonly(struct lws *wsi)
{

	if (!wsi->mux_substream)
		return 1;

	/*
	 * Elect to send an empty DATA with END_STREAM, to force the stream
	 * into HALF_CLOSED LOCAL
	 */
	wsi->h2.long_poll = 1;
	wsi->h2.send_END_STREAM = 1;

	// lws_header_table_detach(wsi, 0);

	lws_callback_on_writable(wsi);

	return 0;
}